

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_Ntk4CollectRing(Acb_Ntk_t *pNtk,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (0 < vStart->nSize) {
    lVar8 = 0;
    do {
      iVar1 = vStart->pArray[lVar8];
      lVar9 = (long)iVar1;
      if ((lVar9 < 0) || (vDists->nSize <= iVar1)) {
LAB_003b0b13:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (iVar1 == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b0b13;
      iVar2 = (pNtk->vObjFans).pArray[lVar9];
      lVar10 = (long)iVar2;
      if ((lVar10 < 0) || ((pNtk->vFanSto).nSize <= iVar2)) {
LAB_003b0af4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = vDists->pArray[lVar9];
      piVar5 = (pNtk->vFanSto).pArray;
      if (0 < piVar5[lVar10]) {
        lVar11 = 0;
        do {
          if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b0b13;
          iVar3 = (pNtk->vObjFans).pArray[lVar9];
          if (((long)iVar3 < 0) || ((pNtk->vFanSto).nSize <= iVar3)) goto LAB_003b0af4;
          lVar7 = lVar11 + 1;
          lVar11 = lVar11 + 1;
          Acb_Ntk4CollectAdd(pNtk,piVar5[lVar10 + lVar7],vRes,vDists,
                             (uint)(1 < (pNtk->vFanSto).pArray[iVar3]) + iVar2);
        } while (lVar11 < piVar5[lVar10]);
      }
      if ((pNtk->vFanouts).nSize <= iVar1) {
LAB_003b0b32:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar10 = 0;
      while (pVVar6 = (pNtk->vFanouts).pArray, lVar10 < pVVar6[lVar9].nSize) {
        iVar3 = pVVar6[lVar9].pArray[lVar10];
        if ((long)iVar3 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((pNtk->vObjType).nSize <= iVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((pNtk->vObjType).pArray[iVar3] != '\0') {
          if ((pNtk->vObjFans).nSize <= iVar1) goto LAB_003b0b13;
          iVar4 = (pNtk->vObjFans).pArray[lVar9];
          if (((long)iVar4 < 0) || ((pNtk->vFanSto).nSize <= iVar4)) goto LAB_003b0af4;
          Acb_Ntk4CollectAdd(pNtk,iVar3,vRes,vDists,
                             iVar2 + (uint)(1 < (pNtk->vFanSto).pArray[iVar4]) * 2);
        }
        lVar10 = lVar10 + 1;
        if ((pNtk->vFanouts).nSize <= iVar1) goto LAB_003b0b32;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vStart->nSize);
  }
  return;
}

Assistant:

void Acb_Ntk4CollectRing( Acb_Ntk_t * pNtk, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, iObj;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int k, iFanin, * pFanins, Weight = Vec_IntEntry(vDists, iObj); 
        Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 1*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
        Acb_ObjForEachFanout( pNtk, iObj, iFanin, k )
            Acb_Ntk4CollectAdd( pNtk, iFanin, vRes, vDists, Weight + 2*(Acb_ObjFaninNum(pNtk, iObj) > 1) );
    }
}